

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_String UA_DateTime_toString(UA_DateTime t)

{
  UA_String UVar1;
  UA_Byte *pos;
  undefined1 local_32 [8];
  UA_DateTimeStruct tSt;
  UA_DateTime t_local;
  UA_String str;
  
  t_local = 0;
  tSt._10_8_ = t;
  pos = (UA_Byte *)malloc(0x20);
  if (pos != (UA_Byte *)0x0) {
    t_local = 0x1f;
    UA_DateTime_toStruct((UA_DateTimeStruct *)local_32,tSt._10_8_);
    printNumber(tSt.sec,pos,2);
    pos[2] = '/';
    printNumber(tSt.milliSec,pos + 3,2);
    pos[5] = '/';
    printNumber(tSt.min,pos + 6,4);
    pos[10] = ' ';
    printNumber(tSt.microSec,pos + 0xb,2);
    pos[0xd] = ':';
    printNumber(tSt.nanoSec,pos + 0xe,2);
    pos[0x10] = ':';
    printNumber(local_32._6_2_,pos + 0x11,2);
    pos[0x13] = '.';
    printNumber(local_32._4_2_,pos + 0x14,3);
    pos[0x17] = '.';
    printNumber(local_32._2_2_,pos + 0x18,3);
    pos[0x1b] = '.';
    printNumber(local_32._0_2_,pos + 0x1c,3);
  }
  UVar1.data = pos;
  UVar1.length = t_local;
  return UVar1;
}

Assistant:

UA_String
UA_DateTime_toString(UA_DateTime t) {
    UA_String str = UA_STRING_NULL;
    // length of the string is 31 (plus \0 at the end)
    if(!(str.data = (UA_Byte*)UA_malloc(32)))
        return str;
    str.length = 31;
    UA_DateTimeStruct tSt = UA_DateTime_toStruct(t);
    printNumber(tSt.month, str.data, 2);
    str.data[2] = '/';
    printNumber(tSt.day, &str.data[3], 2);
    str.data[5] = '/';
    printNumber(tSt.year, &str.data[6], 4);
    str.data[10] = ' ';
    printNumber(tSt.hour, &str.data[11], 2);
    str.data[13] = ':';
    printNumber(tSt.min, &str.data[14], 2);
    str.data[16] = ':';
    printNumber(tSt.sec, &str.data[17], 2);
    str.data[19] = '.';
    printNumber(tSt.milliSec, &str.data[20], 3);
    str.data[23] = '.';
    printNumber(tSt.microSec, &str.data[24], 3);
    str.data[27] = '.';
    printNumber(tSt.nanoSec, &str.data[28], 3);
    return str;
}